

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O3

MaterialHandle __thiscall
pbrt::MaterialHandle::Create
          (MaterialHandle *this,string *name,TextureParameterDictionary *parameters,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
          *namedMaterials,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  uintptr_t iptr_3;
  iterator iVar3;
  MixMaterial *pMVar4;
  CoatedConductorMaterial *pCVar5;
  DielectricMaterial *pDVar6;
  MeasuredMaterial *pMVar7;
  SubsurfaceMaterial *pSVar8;
  long lVar9;
  FileLoc *pFVar10;
  char *pcVar11;
  bool bVar12;
  uintptr_t iptr;
  uintptr_t uVar13;
  ulong uVar14;
  string *name_00;
  long in_FS_OFFSET;
  MaterialHandle materialHandles [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  materials;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  FileLoc *local_40;
  _Base_ptr local_38;
  
  if (name->_M_string_length != 0) {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 != 0) {
      pFVar10 = (FileLoc *)0x4fb174;
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        pSVar8 = (SubsurfaceMaterial *)DiffuseMaterial::Create(parameters,pFVar10,alloc);
        uVar14 = 0x5000000000000;
LAB_003e020f:
        uVar13 = uVar14 | (ulong)pSVar8;
      }
      else {
        pcVar11 = "coateddiffuse";
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          pSVar8 = (SubsurfaceMaterial *)
                   CoatedDiffuseMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
          uVar14 = 0x1000000000000;
          goto LAB_003e020f;
        }
        pcVar11 = "coatedconductor";
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 != 0) {
          pcVar11 = "diffusetransmission";
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 == 0) {
            pSVar8 = (SubsurfaceMaterial *)
                     DiffuseTransmissionMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
            uVar14 = 0x6000000000000;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 == 0) {
              pDVar6 = DielectricMaterial::Create(parameters,loc,alloc);
              uVar13 = (ulong)pDVar6 | 0x4000000000000;
              goto LAB_003e0212;
            }
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 == 0) {
              pSVar8 = (SubsurfaceMaterial *)ThinDielectricMaterial::Create(parameters,loc,alloc);
              uVar14 = 0xa000000000000;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)name);
              if (iVar2 == 0) {
                pSVar8 = (SubsurfaceMaterial *)HairMaterial::Create(parameters,loc,alloc);
                uVar14 = 0x7000000000000;
              }
              else {
                pFVar10 = (FileLoc *)0x291fca4;
                iVar2 = std::__cxx11::string::compare((char *)name);
                if (iVar2 != 0) {
                  pcVar11 = "measured";
                  iVar2 = std::__cxx11::string::compare((char *)name);
                  if (iVar2 == 0) {
                    pMVar7 = MeasuredMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
                    uVar13 = (ulong)pMVar7 | 0x8000000000000;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)name);
                    if (iVar2 == 0) {
                      pSVar8 = SubsurfaceMaterial::Create(parameters,loc,alloc);
                      uVar14 = 0x9000000000000;
                      goto LAB_003e020f;
                    }
                    iVar2 = std::__cxx11::string::compare((char *)name);
                    if (iVar2 != 0) {
                      pcVar11 = "%s: material type unknown.";
                      goto LAB_003e0244;
                    }
                    local_78._0_8_ = &local_68;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_78,"materials","");
                    name_00 = (string *)local_78;
                    TextureParameterDictionary::GetStringArray(&local_58,parameters,name_00);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_78._0_8_ != &local_68) {
                      operator_delete((void *)local_78._0_8_,local_68._M_allocated_capacity + 1);
                    }
                    local_40 = loc;
                    if ((long)local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                      ErrorExit<>(
                                 "Must provide two values for \"string materials\" for mix material."
                                 );
                    }
                    local_38 = &(namedMaterials->_M_t)._M_impl.super__Rb_tree_header._M_header;
                    lVar9 = 0;
                    local_78._0_8_ = (pointer)0x0;
                    local_78._8_8_ = 0;
                    bVar1 = true;
                    do {
                      bVar12 = bVar1;
                      iVar3 = std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
                              ::find(&namedMaterials->_M_t,
                                     local_58.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar9);
                      loc = local_40;
                      if (iVar3._M_node == local_38) {
                        ErrorExit<std::__cxx11::string&>
                                  ("%s: named material not found.",
                                   local_58.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar9);
                      }
                      lVar9 = 1;
                      (name_00->_M_dataplus)._M_p = *(pointer *)(iVar3._M_node + 2);
                      name_00 = (string *)(local_78 + 8);
                      bVar1 = false;
                    } while (bVar12);
                    pMVar4 = MixMaterial::Create((MaterialHandle *)local_78,parameters,local_40,
                                                 alloc);
                    uVar13 = (ulong)pMVar4 | 0xb000000000000;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_58);
                  }
                  goto LAB_003e0212;
                }
                pSVar8 = (SubsurfaceMaterial *)ConductorMaterial::Create(parameters,pFVar10,alloc);
                uVar14 = 0x3000000000000;
              }
            }
          }
          goto LAB_003e020f;
        }
        pCVar5 = CoatedConductorMaterial::Create(parameters,(FileLoc *)pcVar11,alloc);
        uVar13 = (ulong)pCVar5 | 0x2000000000000;
      }
LAB_003e0212:
      if ((uVar13 & 0xffffffffffff) == 0) {
        pcVar11 = "%s: unable to create material.";
LAB_003e0244:
        ErrorExit<std::__cxx11::string_const&>(loc,pcVar11,name);
      }
      TextureParameterDictionary::ReportUnused(parameters);
      *(long *)(in_FS_OFFSET + -0x368) = *(long *)(in_FS_OFFSET + -0x368) + 1;
      goto LAB_003e0228;
    }
  }
  uVar13 = 0;
LAB_003e0228:
  (this->
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  ).bits = uVar13;
  return (MaterialHandle)
         (TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          )this;
}

Assistant:

MaterialHandle MaterialHandle::Create(
    const std::string &name, const TextureParameterDictionary &parameters,
    /*const */ std::map<std::string, MaterialHandle> &namedMaterials, const FileLoc *loc,
    Allocator alloc) {
    MaterialHandle material;
    if (name.empty() || name == "none")
        return nullptr;
    else if (name == "diffuse")
        material = DiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coateddiffuse")
        material = CoatedDiffuseMaterial::Create(parameters, loc, alloc);
    else if (name == "coatedconductor")
        material = CoatedConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "diffusetransmission")
        material = DiffuseTransmissionMaterial::Create(parameters, loc, alloc);
    else if (name == "dielectric")
        material = DielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "thindielectric")
        material = ThinDielectricMaterial::Create(parameters, loc, alloc);
    else if (name == "hair")
        material = HairMaterial::Create(parameters, loc, alloc);
    else if (name == "conductor")
        material = ConductorMaterial::Create(parameters, loc, alloc);
    else if (name == "measured")
        material = MeasuredMaterial::Create(parameters, loc, alloc);
    else if (name == "subsurface")
        material = SubsurfaceMaterial::Create(parameters, loc, alloc);
    else if (name == "mix") {
        std::vector<std::string> materials = parameters.GetStringArray("materials");
        if (materials.size() != 2)
            ErrorExit(
                "Must provide two values for \"string materials\" for mix material.");

        MaterialHandle materialHandles[2];
        for (int i = 0; i < 2; ++i) {
            auto iter = namedMaterials.find(materials[i]);
            if (iter == namedMaterials.end())
                ErrorExit("%s: named material not found.", materials[i]);
            materialHandles[i] = iter->second;
        }
        material = MixMaterial::Create(materialHandles, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: material type unknown.", name);

    if (!material)
        ErrorExit(loc, "%s: unable to create material.", name);

    parameters.ReportUnused();
    ++nMaterialsCreated;
    return material;
}